

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMAttrMapImpl.cpp
# Opt level: O2

void __thiscall
xercesc_4_0::DOMAttrMapImpl::cloneContent(DOMAttrMapImpl *this,DOMAttrMapImpl *srcmap)

{
  XMLSize_t size;
  DOMNode *pDVar1;
  ushort uVar2;
  int iVar3;
  long lVar4;
  DOMNodeVector *this_00;
  undefined4 extraout_var_00;
  DOMNodeImpl *pDVar5;
  DOMNodeImpl *pDVar6;
  ushort uVar7;
  XMLSize_t i;
  ulong uVar8;
  long *plVar9;
  DOMDocument *doc;
  DOMNode *p;
  undefined4 extraout_var;
  
  if ((srcmap != (DOMAttrMapImpl *)0x0) && (srcmap->fNodes != (DOMNodeVector *)0x0)) {
    if (this->fNodes == (DOMNodeVector *)0x0) {
      size = srcmap->fNodes->nextFreeSlot;
      if (size != 0) {
        iVar3 = (*this->fOwnerNode->_vptr_DOMNode[0xc])();
        lVar4 = CONCAT44(extraout_var,iVar3);
        plVar9 = (long *)(lVar4 + -8);
        if (lVar4 == 0) {
          plVar9 = (long *)0x0;
        }
        doc = (DOMDocument *)(plVar9 + 1);
        if (lVar4 == 0) {
          doc = (DOMDocument *)0x0;
        }
        this_00 = (DOMNodeVector *)(**(code **)(*plVar9 + 0x20))(plVar9,0x18);
        DOMNodeVector::DOMNodeVector(this_00,doc,size);
        this->fNodes = this_00;
      }
    }
    else {
      DOMNodeVector::reset(this->fNodes);
    }
    for (uVar8 = 0; uVar8 < srcmap->fNodes->nextFreeSlot; uVar8 = uVar8 + 1) {
      pDVar1 = srcmap->fNodes->data[uVar8];
      iVar3 = (*pDVar1->_vptr_DOMNode[0xd])(pDVar1,1);
      p = (DOMNode *)CONCAT44(extraout_var_00,iVar3);
      pDVar5 = castToNodeImpl(p);
      pDVar6 = castToNodeImpl(pDVar1);
      uVar2 = (ushort)*(undefined4 *)&pDVar5->flags;
      uVar7 = uVar2 & 0xffdf;
      if ((pDVar6->flags & 0x20) != 0) {
        uVar7 = uVar2 | 0x20;
      }
      pDVar5->flags = uVar7;
      pDVar1 = this->fOwnerNode;
      pDVar5 = castToNodeImpl(p);
      pDVar5->fOwnerNode = pDVar1;
      pDVar5 = castToNodeImpl(p);
      pDVar5->flags = pDVar5->flags | 8;
      DOMNodeVector::addElement(this->fNodes,p);
    }
  }
  return;
}

Assistant:

void DOMAttrMapImpl::cloneContent(const DOMAttrMapImpl *srcmap)
{
    if ((srcmap != 0) && (srcmap->fNodes != 0))
    {
        if (fNodes != 0)
            fNodes->reset();
        else
        {
            XMLSize_t size = srcmap->fNodes->size();
            if(size > 0) {
                DOMDocumentImpl *doc = (DOMDocumentImpl*)fOwnerNode->getOwnerDocument();
                fNodes = new (doc) DOMNodeVector(doc, size);
            }
        }

        for (XMLSize_t i = 0; i < srcmap->fNodes->size(); i++)
        {
            DOMNode *n = srcmap->fNodes->elementAt(i);
            DOMNode *clone = n->cloneNode(true);
            castToNodeImpl(clone)->isSpecified(castToNodeImpl(n)->isSpecified());
            castToNodeImpl(clone)->fOwnerNode = fOwnerNode;
            castToNodeImpl(clone)->isOwned(true);
            fNodes->addElement(clone);
        }
    }
}